

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcamera.h
# Opt level: O2

void UpdateCamera(Camera *camera,int mode)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  bool rotateAroundTarget;
  _Bool lockView;
  uint uVar5;
  float fVar6;
  Vector2 VVar7;
  undefined1 auVar8 [16];
  float fVar9;
  float fVar10;
  float fVar11;
  Vector3 axis;
  float local_78;
  float fStack_74;
  Matrix rotation;
  
  VVar7 = GetMouseDelta();
  if ((4 < (uint)mode) || (lockView = true, (0x1aU >> (mode & 0x1fU) & 1) == 0)) {
    lockView = mode == 2;
  }
  if (mode != 0) {
    fVar6 = (float)CORE.Time.frame;
    if (mode == 2) {
      axis = GetCameraUp(camera);
      MatrixRotate(&rotation,axis,fVar6 * 0.5);
      uVar1 = (camera->position).x;
      uVar3 = (camera->position).y;
      uVar2 = (camera->target).x;
      uVar4 = (camera->target).y;
      fVar6 = (camera->target).z;
      fVar10 = (float)uVar1 - (float)uVar2;
      fVar11 = (float)uVar3 - (float)uVar4;
      fVar9 = (camera->position).z - fVar6;
      (camera->position).x =
           rotation.m12 + fVar9 * rotation.m8 + fVar10 * rotation.m0 + rotation.m4 * fVar11 +
           (float)uVar2;
      (camera->position).y =
           rotation.m13 + fVar9 * rotation.m9 + fVar10 * rotation.m1 + rotation.m5 * fVar11 +
           (float)uVar4;
      (camera->position).z =
           rotation.m10 * fVar9 + rotation.m2 * fVar10 + rotation.m6 * fVar11 + rotation.m14 + fVar6
      ;
    }
    else {
      rotateAroundTarget = mode == 4 || mode == 2;
      fVar9 = fVar6 * 0.03;
      if (CORE.Input.Keyboard.currentKeyState[0x108] == '\x01') {
        CameraPitch(camera,-fVar9,lockView,rotateAroundTarget,false);
      }
      if (CORE.Input.Keyboard.currentKeyState[0x109] == '\x01') {
        CameraPitch(camera,fVar9,lockView,rotateAroundTarget,false);
      }
      if (CORE.Input.Keyboard.currentKeyState[0x106] == '\x01') {
        CameraYaw(camera,-fVar9,rotateAroundTarget);
      }
      if (CORE.Input.Keyboard.currentKeyState[0x107] == '\x01') {
        CameraYaw(camera,fVar9,rotateAroundTarget);
      }
      if (CORE.Input.Keyboard.currentKeyState[0x51] == '\x01') {
        CameraRoll(camera,-fVar9);
      }
      if (CORE.Input.Keyboard.currentKeyState[0x45] == '\x01') {
        CameraRoll(camera,fVar9);
      }
      uVar5 = mode - 3;
      fStack_74 = VVar7.y;
      if ((mode == 1) &&
         ((CORE.Input.Touch.currentTouchState[2] == '\x01' ||
          (CORE.Input.Mouse.currentButtonState[2] == '\x01')))) {
        fVar9 = fVar6 * 0.2;
        VVar7 = GetMouseDelta();
        if (0.0 < VVar7.x) {
          CameraMoveRight(camera,fVar9,uVar5 < 2);
        }
        if (VVar7.x < 0.0) {
          CameraMoveRight(camera,-fVar9,uVar5 < 2);
        }
        if (0.0 < VVar7.y) {
          CameraMoveUp(camera,-fVar9);
        }
        if (VVar7.y < 0.0) {
          CameraMoveUp(camera,fVar9);
        }
      }
      else {
        local_78 = VVar7.x;
        CameraYaw(camera,local_78 * -0.003,rotateAroundTarget);
        CameraPitch(camera,fStack_74 * -0.003,lockView,rotateAroundTarget,false);
      }
      fVar6 = fVar6 * 5.4;
      if (CORE.Input.Keyboard.currentKeyState[0x57] == '\x01') {
        CameraMoveForward(camera,fVar6,uVar5 < 2);
      }
      if (CORE.Input.Keyboard.currentKeyState[0x41] == '\x01') {
        CameraMoveRight(camera,-fVar6,uVar5 < 2);
      }
      if (CORE.Input.Keyboard.currentKeyState[0x53] == '\x01') {
        CameraMoveForward(camera,-fVar6,uVar5 < 2);
      }
      if (CORE.Input.Keyboard.currentKeyState[0x44] == '\x01') {
        CameraMoveRight(camera,fVar6,uVar5 < 2);
      }
      if (CORE.Input.Gamepad.ready[0] == true) {
        fVar9 = CORE.Input.Gamepad.axisState[0][2];
        if (CORE.Input.Gamepad.axisState[0][2] == 0.0) {
          fVar9 = 0.0;
        }
        CameraYaw(camera,fVar9 * -2.0 * 0.003,rotateAroundTarget);
        fVar9 = -0.0;
        if ((CORE.Input.Gamepad.ready[0] == true) && (CORE.Input.Gamepad.axisState[0][3] != 0.0)) {
          fVar9 = CORE.Input.Gamepad.axisState[0][3] * -2.0 * 0.003;
        }
        CameraPitch(camera,fVar9,lockView,rotateAroundTarget,false);
        if (((CORE.Input.Gamepad.ready[0] == true) && (CORE.Input.Gamepad.axisState[0][1] != 0.0))
           && (CORE.Input.Gamepad.axisState[0][1] <= -0.25)) {
          CameraMoveForward(camera,fVar6,uVar5 < 2);
        }
        if ((((CORE.Input.Gamepad.ready[0] & 1U) != 0) &&
            (CORE.Input.Gamepad.axisState[0][0] != 0.0)) &&
           (CORE.Input.Gamepad.axisState[0][0] <= -0.25)) {
          CameraMoveRight(camera,-fVar6,uVar5 < 2);
        }
        if ((((CORE.Input.Gamepad.ready[0] & 1U) != 0) &&
            (CORE.Input.Gamepad.axisState[0][1] != 0.0)) &&
           (0.25 <= CORE.Input.Gamepad.axisState[0][1])) {
          CameraMoveForward(camera,-fVar6,uVar5 < 2);
        }
        if ((((CORE.Input.Gamepad.ready[0] & 1U) != 0) &&
            (CORE.Input.Gamepad.axisState[0][0] != 0.0)) &&
           (0.25 <= CORE.Input.Gamepad.axisState[0][0])) {
          CameraMoveRight(camera,fVar6,uVar5 < 2);
        }
      }
      if (mode == 1) {
        if (CORE.Input.Keyboard.currentKeyState[0x20] == '\x01') {
          CameraMoveUp(camera,fVar6);
        }
        if (CORE.Input.Keyboard.currentKeyState[0x155] == '\x01') {
          CameraMoveUp(camera,-fVar6);
        }
      }
      else if ((mode != 4) && (mode != 2)) {
        return;
      }
    }
    auVar8._8_8_ = 0;
    auVar8._0_4_ = CORE.Input.Mouse.currentWheelMove.x;
    auVar8._4_4_ = CORE.Input.Mouse.currentWheelMove.y;
    uVar5 = -(uint)(SUB164(_DAT_001b5cb0 & auVar8,4) < SUB164(_DAT_001b5cb0 & auVar8,0));
    CameraMoveToTarget(camera,-(float)(~uVar5 & (uint)CORE.Input.Mouse.currentWheelMove.y |
                                      uVar5 & (uint)CORE.Input.Mouse.currentWheelMove.x));
    if ((CORE.Input.Keyboard.previousKeyState[0x14d] == '\0') &&
       (CORE.Input.Keyboard.currentKeyState[0x14d] == '\x01')) {
      CameraMoveToTarget(camera,2.0);
    }
    if ((CORE.Input.Keyboard.previousKeyState[0x14e] == '\0') &&
       (CORE.Input.Keyboard.currentKeyState[0x14e] == '\x01')) {
      CameraMoveToTarget(camera,-2.0);
      return;
    }
  }
  return;
}

Assistant:

void UpdateCamera(Camera *camera, int mode)
{
    Vector2 mousePositionDelta = GetMouseDelta();

    bool moveInWorldPlane = ((mode == CAMERA_FIRST_PERSON) || (mode == CAMERA_THIRD_PERSON));
    bool rotateAroundTarget = ((mode == CAMERA_THIRD_PERSON) || (mode == CAMERA_ORBITAL));
    bool lockView = ((mode == CAMERA_FREE) || (mode == CAMERA_FIRST_PERSON) || (mode == CAMERA_THIRD_PERSON) || (mode == CAMERA_ORBITAL));
    bool rotateUp = false;

    // Camera speeds based on frame time
    float cameraMoveSpeed = CAMERA_MOVE_SPEED*GetFrameTime();
    float cameraRotationSpeed = CAMERA_ROTATION_SPEED*GetFrameTime();
    float cameraPanSpeed = CAMERA_PAN_SPEED*GetFrameTime();
    float cameraOrbitalSpeed = CAMERA_ORBITAL_SPEED*GetFrameTime();

    if (mode == CAMERA_CUSTOM) {}
    else if (mode == CAMERA_ORBITAL)
    {
        // Orbital can just orbit
        Matrix rotation = MatrixRotate(GetCameraUp(camera), cameraOrbitalSpeed);
        Vector3 view = Vector3Subtract(camera->position, camera->target);
        view = Vector3Transform(view, rotation);
        camera->position = Vector3Add(camera->target, view);
    }
    else
    {
        // Camera rotation
        if (IsKeyDown(KEY_DOWN)) CameraPitch(camera, -cameraRotationSpeed, lockView, rotateAroundTarget, rotateUp);
        if (IsKeyDown(KEY_UP)) CameraPitch(camera, cameraRotationSpeed, lockView, rotateAroundTarget, rotateUp);
        if (IsKeyDown(KEY_RIGHT)) CameraYaw(camera, -cameraRotationSpeed, rotateAroundTarget);
        if (IsKeyDown(KEY_LEFT)) CameraYaw(camera, cameraRotationSpeed, rotateAroundTarget);
        if (IsKeyDown(KEY_Q)) CameraRoll(camera, -cameraRotationSpeed);
        if (IsKeyDown(KEY_E)) CameraRoll(camera, cameraRotationSpeed);

        // Camera movement
        // Camera pan (for CAMERA_FREE)
        if ((mode == CAMERA_FREE) && (IsMouseButtonDown(MOUSE_BUTTON_MIDDLE)))
        {
            const Vector2 mouseDelta = GetMouseDelta();
            if (mouseDelta.x > 0.0f) CameraMoveRight(camera, cameraPanSpeed, moveInWorldPlane);
            if (mouseDelta.x < 0.0f) CameraMoveRight(camera, -cameraPanSpeed, moveInWorldPlane);
            if (mouseDelta.y > 0.0f) CameraMoveUp(camera, -cameraPanSpeed);
            if (mouseDelta.y < 0.0f) CameraMoveUp(camera, cameraPanSpeed);
        }
        else
        {
            // Mouse support
            CameraYaw(camera, -mousePositionDelta.x*CAMERA_MOUSE_MOVE_SENSITIVITY, rotateAroundTarget);
            CameraPitch(camera, -mousePositionDelta.y*CAMERA_MOUSE_MOVE_SENSITIVITY, lockView, rotateAroundTarget, rotateUp);
        }

        // Keyboard support
        if (IsKeyDown(KEY_W)) CameraMoveForward(camera, cameraMoveSpeed, moveInWorldPlane);
        if (IsKeyDown(KEY_A)) CameraMoveRight(camera, -cameraMoveSpeed, moveInWorldPlane);
        if (IsKeyDown(KEY_S)) CameraMoveForward(camera, -cameraMoveSpeed, moveInWorldPlane);
        if (IsKeyDown(KEY_D)) CameraMoveRight(camera, cameraMoveSpeed, moveInWorldPlane);

        // Gamepad movement
        if (IsGamepadAvailable(0))
        {
            // Gamepad controller support
            CameraYaw(camera, -(GetGamepadAxisMovement(0, GAMEPAD_AXIS_RIGHT_X)*2)*CAMERA_MOUSE_MOVE_SENSITIVITY, rotateAroundTarget);
            CameraPitch(camera, -(GetGamepadAxisMovement(0, GAMEPAD_AXIS_RIGHT_Y)*2)*CAMERA_MOUSE_MOVE_SENSITIVITY, lockView, rotateAroundTarget, rotateUp);

            if (GetGamepadAxisMovement(0, GAMEPAD_AXIS_LEFT_Y) <= -0.25f) CameraMoveForward(camera, cameraMoveSpeed, moveInWorldPlane);
            if (GetGamepadAxisMovement(0, GAMEPAD_AXIS_LEFT_X) <= -0.25f) CameraMoveRight(camera, -cameraMoveSpeed, moveInWorldPlane);
            if (GetGamepadAxisMovement(0, GAMEPAD_AXIS_LEFT_Y) >= 0.25f) CameraMoveForward(camera, -cameraMoveSpeed, moveInWorldPlane);
            if (GetGamepadAxisMovement(0, GAMEPAD_AXIS_LEFT_X) >= 0.25f) CameraMoveRight(camera, cameraMoveSpeed, moveInWorldPlane);
        }

        if (mode == CAMERA_FREE)
        {
            if (IsKeyDown(KEY_SPACE)) CameraMoveUp(camera, cameraMoveSpeed);
            if (IsKeyDown(KEY_LEFT_CONTROL)) CameraMoveUp(camera, -cameraMoveSpeed);
        }
    }

    if ((mode == CAMERA_THIRD_PERSON) || (mode == CAMERA_ORBITAL) || (mode == CAMERA_FREE))
    {
        // Zoom target distance
        CameraMoveToTarget(camera, -GetMouseWheelMove());
        if (IsKeyPressed(KEY_KP_SUBTRACT)) CameraMoveToTarget(camera, 2.0f);
        if (IsKeyPressed(KEY_KP_ADD)) CameraMoveToTarget(camera, -2.0f);
    }
}